

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

amqp_rpc_reply_t *
amqp_basic_get(amqp_connection_state_t state,amqp_channel_t channel,amqp_bytes_t queue,
              amqp_boolean_t no_ack)

{
  long in_RSI;
  amqp_rpc_reply_t *in_RDI;
  amqp_basic_get_t req;
  amqp_method_number_t replies [3];
  undefined8 local_70;
  void *in_stack_ffffffffffffff98;
  amqp_method_number_t *in_stack_ffffffffffffffa0;
  amqp_method_number_t in_stack_ffffffffffffffa8;
  undefined2 uStack_54;
  amqp_channel_t in_stack_ffffffffffffffae;
  uint6 in_stack_ffffffffffffffb2;
  
  amqp_simple_rpc((amqp_connection_state_t)((ulong)in_stack_ffffffffffffffb2 << 0x10),
                  in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                  in_stack_ffffffffffffff98);
  *(undefined8 *)(in_RSI + 0x110) = local_70;
  *(void **)(in_RSI + 0x118) = in_stack_ffffffffffffff98;
  *(amqp_method_number_t **)(in_RSI + 0x120) = in_stack_ffffffffffffffa0;
  *(ulong *)(in_RSI + 0x128) =
       CONCAT26(in_stack_ffffffffffffffae,CONCAT24(uStack_54,in_stack_ffffffffffffffa8));
  *(undefined8 *)in_RDI = *(undefined8 *)(in_RSI + 0x110);
  *(undefined8 *)&in_RDI->reply = *(undefined8 *)(in_RSI + 0x118);
  (in_RDI->reply).decoded = *(void **)(in_RSI + 0x120);
  *(undefined8 *)&in_RDI->library_error = *(undefined8 *)(in_RSI + 0x128);
  return in_RDI;
}

Assistant:

amqp_rpc_reply_t amqp_basic_get(amqp_connection_state_t state,
                                amqp_channel_t channel, amqp_bytes_t queue,
                                amqp_boolean_t no_ack) {
  amqp_method_number_t replies[] = {AMQP_BASIC_GET_OK_METHOD,
                                    AMQP_BASIC_GET_EMPTY_METHOD, 0};
  amqp_basic_get_t req;
  req.ticket = 0;
  req.queue = queue;
  req.no_ack = no_ack;

  state->most_recent_api_result =
      amqp_simple_rpc(state, channel, AMQP_BASIC_GET_METHOD, replies, &req);
  return state->most_recent_api_result;
}